

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

void __thiscall gl4cts::CopyImage::ExceedingBoundariesTest::clean(ExceedingBoundariesTest *this)

{
  uint uVar1;
  pointer ptVar2;
  
  uVar1 = this->m_test_case_index;
  ptVar2 = (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  Utils::deleteTexture
            ((this->super_TestCase).m_context,ptVar2[uVar1].m_tex_target,this->m_dst_tex_name);
  Utils::deleteTexture
            ((this->super_TestCase).m_context,ptVar2[uVar1].m_tex_target,this->m_src_tex_name);
  this->m_dst_tex_name = 0;
  this->m_src_tex_name = 0;
  return;
}

Assistant:

void ExceedingBoundariesTest::clean()
{
	const testCase& test_case = m_test_cases[m_test_case_index];

	/* Clean textures and buffers. Errors ignored */
	Utils::deleteTexture(m_context, test_case.m_tex_target, m_dst_tex_name);
	Utils::deleteTexture(m_context, test_case.m_tex_target, m_src_tex_name);

	m_dst_tex_name = 0;
	m_src_tex_name = 0;
}